

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O3

ActionResult __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckAction(ScriptValidator *this,Action *action)

{
  _func_int **pp_Var1;
  Module *pMVar2;
  Export *pEVar3;
  Func *pFVar4;
  Global *pGVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  anon_union_8_2_516a9242_for_ActionResult_2 aVar10;
  string_view name;
  string_view name_00;
  ActionResult AVar11;
  
  if (action->type_ == Get) {
    pMVar2 = Script::GetModule(this->script_,&action->module_var);
    if (pMVar2 == (Module *)0x0) {
      PrintError(this,&action->loc,"unknown module");
    }
    else {
      name_00._M_str = (action->name)._M_dataplus._M_p;
      name_00._M_len = (action->name)._M_string_length;
      pEVar3 = Module::GetExport(pMVar2,name_00);
      if (pEVar3 == (Export *)0x0) {
        PrintError(this,&action->loc,"unknown global export \"%s\"",(action->name)._M_dataplus._M_p)
        ;
      }
      else {
        pGVar5 = Module::GetGlobal(pMVar2,&pEVar3->var);
        if (pGVar5 != (Global *)0x0) {
          aVar10 = (anon_union_8_2_516a9242_for_ActionResult_2)
                   *(anon_union_8_2_516a9242_for_ActionResult_2 *)&pGVar5->type;
          uVar7 = 2;
          goto LAB_0012ece9;
        }
      }
    }
  }
  else if (action->type_ == Invoke) {
    pMVar2 = Script::GetModule(this->script_,&action->module_var);
    if (pMVar2 == (Module *)0x0) {
      aVar10.types = (TypeVector *)0x0;
      PrintError(this,&action->loc,"unknown module");
    }
    else {
      name._M_str = (action->name)._M_dataplus._M_p;
      name._M_len = (action->name)._M_string_length;
      pEVar3 = Module::GetExport(pMVar2,name);
      if (pEVar3 == (Export *)0x0) {
        aVar10.types = (TypeVector *)0x0;
        PrintError(this,&action->loc,"unknown function export \"%s\"",
                   (action->name)._M_dataplus._M_p);
      }
      else {
        pFVar4 = Module::GetFunc(pMVar2,&pEVar3->var);
        if (pFVar4 == (Func *)0x0) {
          aVar10.types = (TypeVector *)0x0;
        }
        else {
          pp_Var1 = (_func_int **)action[1].loc.filename._M_len;
          uVar8 = ((long)pp_Var1 - (long)action[1]._vptr_Action >> 4) * -0x3333333333333333;
          uVar7 = (ulong)((long)(pFVar4->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pFVar4->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
          if (uVar8 - uVar7 == 0) {
            if (pp_Var1 != action[1]._vptr_Action) {
              lVar9 = 0;
              uVar7 = 0;
              do {
                CheckTypeIndex(this,(Location *)((long)action[1]._vptr_Action + lVar9),
                               *(Type *)((long)action[1]._vptr_Action + lVar9 + 0x20),
                               (pFVar4->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar7 & 0xffffffff],"invoke",
                               (Index)uVar7,"argument");
                uVar7 = uVar7 + 1;
                lVar9 = lVar9 + 0x50;
              } while (uVar8 + (uVar8 == 0) != uVar7);
            }
            aVar10.types = &(pFVar4->decl).sig.result_types;
          }
          else {
            pcVar6 = "few";
            if (uVar7 <= uVar8 && uVar8 - uVar7 != 0) {
              pcVar6 = "many";
            }
            aVar10.types = (TypeVector *)0x0;
            PrintError(this,&action->loc,"too %s parameters to function. got %zd, expected %zd",
                       pcVar6,uVar8);
          }
        }
      }
    }
    uVar7 = (ulong)((Type)aVar10.types != (Type)0x0);
    goto LAB_0012ece9;
  }
  uVar7 = 0;
  aVar10.types = (TypeVector *)0x0;
LAB_0012ece9:
  AVar11.field_1.types = aVar10.types;
  AVar11._0_8_ = uVar7;
  return AVar11;
}

Assistant:

ScriptValidator::ActionResult ScriptValidator::CheckAction(
    const Action* action) {
  ActionResult result;
  ZeroMemory(result);

  switch (action->type()) {
    case ActionType::Invoke:
      result.types = CheckInvoke(cast<InvokeAction>(action));
      result.kind =
          result.types ? ActionResult::Kind::Types : ActionResult::Kind::Error;
      break;

    case ActionType::Get:
      if (Succeeded(CheckGet(cast<GetAction>(action), &result.type))) {
        result.kind = ActionResult::Kind::Type;
      } else {
        result.kind = ActionResult::Kind::Error;
      }
      break;
  }

  return result;
}